

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FederateInfo.cpp
# Opt level: O1

FederateInfo * helics::loadFederateInfo(FederateInfo *__return_storage_ptr__,string *configString)

{
  ConfigType CVar1;
  long lVar2;
  string_view configString_00;
  
  FederateInfo::FederateInfo(__return_storage_ptr__);
  configString_00._M_str = (configString->_M_dataplus)._M_p;
  configString_00._M_len = configString->_M_string_length;
  CVar1 = fileops::getConfigType(configString_00);
  switch(CVar1) {
  case JSON_STRING:
    FederateInfo::loadInfoFromJson(__return_storage_ptr__,configString,true);
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
              (&__return_storage_ptr__->configString,configString);
    break;
  case JSON_FILE:
    __return_storage_ptr__->fileInUse = true;
    lVar2 = 0x180;
    FederateInfo::loadInfoFromJson(__return_storage_ptr__,configString,true);
    goto LAB_00291328;
  case TOML_STRING:
    FederateInfo::loadInfoFromToml(__return_storage_ptr__,configString,true);
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
              (&__return_storage_ptr__->configString,configString);
    break;
  case TOML_FILE:
    __return_storage_ptr__->fileInUse = true;
    lVar2 = 0x180;
    FederateInfo::loadInfoFromToml(__return_storage_ptr__,configString,true);
    goto LAB_00291328;
  case CMD_LINE:
    FederateInfo::loadInfoFromArgsIgnoreOutput(__return_storage_ptr__,configString);
    break;
  case NONE:
    lVar2 = 0xa0;
LAB_00291328:
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               ((long)&(__return_storage_ptr__->super_CoreFederateInfo).timeProps.
                       super__Vector_base<std::pair<int,_TimeRepresentation<count_time<9,_long>_>_>,_std::allocator<std::pair<int,_TimeRepresentation<count_time<9,_long>_>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start + lVar2),configString);
  }
  return __return_storage_ptr__;
}

Assistant:

FederateInfo loadFederateInfo(const std::string& configString)
{
    FederateInfo ret;
    auto type = fileops::getConfigType(configString);
    switch (type) {
        case fileops::ConfigType::JSON_FILE:
            ret.fileInUse = true;
            ret.loadInfoFromJson(configString);
            ret.configString = configString;
            break;
        case fileops::ConfigType::JSON_STRING:
            try {
                ret.loadInfoFromJson(configString);
                ret.configString = configString;
            }
            catch (const helics::InvalidParameter&) {
                if (fileops::looksLikeConfigToml(configString)) {
                    try {
                        ret.loadInfoFromToml(configString);
                        ret.configString = configString;
                    }
                    catch (const helics::InvalidParameter&) {
                        if (fileops::looksLikeCommandLine(configString)) {
                            ret.loadInfoFromArgsIgnoreOutput(configString);
                            break;
                        }
                        throw;
                    }
                }
                throw;
            }
            break;
        case fileops::ConfigType::TOML_FILE:
            ret.fileInUse = true;
            ret.loadInfoFromToml(configString);
            ret.configString = configString;
            break;
        case fileops::ConfigType::TOML_STRING:
            try {
                ret.loadInfoFromToml(configString);
                ret.configString = configString;
            }
            catch (const helics::InvalidParameter&) {
                if (fileops::looksLikeCommandLine(configString)) {
                    ret.loadInfoFromArgsIgnoreOutput(configString);
                    break;
                }
                throw;
            }
            break;
        case fileops::ConfigType::CMD_LINE:
            ret.loadInfoFromArgsIgnoreOutput(configString);
            break;
        case fileops::ConfigType::NONE:
            ret.defName = configString;
    }

    return ret;
}